

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O1

void D_ErrorCleanup(void)

{
  savegamerestore = false;
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[9])();
  FCajunMaster::RemoveAllBots(&bglobal,true);
  D_QuitNetGame();
  if ((demorecording != false) || (demoplayback == true)) {
    G_CheckDemoStatus();
  }
  Net_ClearBuffers();
  G_NewInit();
  singletics = false;
  playeringame[0] = true;
  DAT_00a39298 = 0;
  gameaction = ga_fullconsole;
  if (gamestate == GS_DEMOSCREEN) {
    menuactive = MENU_Off;
  }
  insave = false;
  (*Renderer->_vptr_FRenderer[0xd])();
  return;
}

Assistant:

void D_ErrorCleanup ()
{
	savegamerestore = false;
	screen->Unlock ();
	bglobal.RemoveAllBots (true);
	D_QuitNetGame ();
	if (demorecording || demoplayback)
		G_CheckDemoStatus ();
	Net_ClearBuffers ();
	G_NewInit ();
	singletics = false;
	playeringame[0] = 1;
	players[0].playerstate = PST_LIVE;
	gameaction = ga_fullconsole;
	if (gamestate == GS_DEMOSCREEN)
	{
		menuactive = MENU_Off;
	}
	insave = false;
	Renderer->ErrorCleanup();
}